

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-print.cc
# Opt level: O0

void __thiscall IR::Print::visit(Print *this,Restore *s)

{
  basic_ostream<char,_std::char_traits<char>_> *os;
  Temp *this_00;
  string *args;
  Restore *s_local;
  Print *this_local;
  
  os = this->out;
  this_00 = Restore::source(s);
  args = Temp::name_abi_cxx11_(this_00);
  fmt::v7::print<char[16],std::__cxx11::string_const&,char>
            (os,(char (*) [16])"\tyyrewind({0});",args);
  std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Print::visit(IR::Restore* s) {
  fmt::print(out, "\tyyrewind({0});", s->source()->name());
  out << std::endl;
}